

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpretedLiteralEvaluator.cpp
# Opt level: O0

bool __thiscall
Kernel::InterpretedLiteralEvaluator::RatEvaluator::tryEvaluateUnaryFunc
          (RatEvaluator *this,Interpretation op,Value *arg,Value *res)

{
  char *in_RDX;
  undefined4 in_ESI;
  double in_XMM0_Qa;
  RationalConstantType *in_stack_fffffffffffffee8;
  RationalConstantType *in_stack_fffffffffffffef0;
  RationalConstantType *pRVar1;
  IntegerConstantType *in_stack_fffffffffffffef8;
  IntegerConstantType *n;
  RationalConstantType *in_stack_ffffffffffffff00;
  RationalConstantType *in_stack_ffffffffffffff28;
  RationalConstantType *in_stack_ffffffffffffff38;
  IntegerConstantType local_b8 [3];
  RationalConstantType local_88 [4];
  bool local_1;
  
  switch(in_ESI) {
  case 0x27:
    RationalConstantType::operator-(in_stack_ffffffffffffff28);
    RationalConstantType::operator=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    RationalConstantType::~RationalConstantType(in_stack_fffffffffffffef0);
    local_1 = true;
    break;
  default:
    local_1 = false;
    break;
  case 0x32:
    pRVar1 = local_88;
    RationalConstantType::floor(pRVar1,in_XMM0_Qa);
    RationalConstantType::RationalConstantType(pRVar1,in_stack_fffffffffffffef8);
    RationalConstantType::operator=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    RationalConstantType::~RationalConstantType(in_stack_fffffffffffffef0);
    IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x87ca92);
    local_1 = true;
    break;
  case 0x33:
    n = local_b8;
    RationalConstantType::ceiling(in_stack_ffffffffffffff38);
    RationalConstantType::RationalConstantType(in_stack_ffffffffffffff00,n);
    RationalConstantType::operator=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    RationalConstantType::~RationalConstantType(in_stack_fffffffffffffef0);
    IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x87cb38);
    local_1 = true;
    break;
  case 0x34:
    pRVar1 = (RationalConstantType *)&stack0xffffffffffffff18;
    RationalConstantType::truncate(pRVar1,in_RDX,(__off_t)in_RDX);
    RationalConstantType::RationalConstantType(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    RationalConstantType::operator=(pRVar1,in_stack_fffffffffffffee8);
    RationalConstantType::~RationalConstantType(pRVar1);
    IntegerConstantType::~IntegerConstantType((IntegerConstantType *)0x87cbd8);
    local_1 = true;
  }
  return local_1;
}

Assistant:

virtual bool tryEvaluateUnaryFunc(Interpretation op, const Value& arg, Value& res)
  {
    switch(op) {
    case Theory::RAT_UNARY_MINUS:
      res = -arg;
      return true;
    case Theory::RAT_FLOOR:
      res = RationalConstantType(arg.floor());
      return true;
    case Theory::RAT_CEILING:
      res = RationalConstantType(arg.ceiling());
      return true;
    case Theory::RAT_TRUNCATE:
      res = RationalConstantType(arg.truncate());
      return true;
    default:
      return false;
    }
  }